

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVD.hpp
# Opt level: O1

void __thiscall JAMA::SVD<double>::SVD(SVD<double> *this,DynamicRectMatrix<double> *Arg)

{
  double dVar1;
  pointer pdVar2;
  double **ppdVar3;
  double **ppdVar4;
  long lVar5;
  pointer pdVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  double **ppdVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  DynamicVector<double,_std::allocator<double>_> *pDVar22;
  ulong uVar23;
  long lVar24;
  double dVar25;
  double *pdVar26;
  double *pdVar27;
  DynamicVector<double,_std::allocator<double>_> e;
  DynamicRectMatrix<double> A;
  DynamicVector<double,_std::allocator<double>_> work;
  vector<double,_std::allocator<double>_> local_140;
  uint local_128;
  undefined8 local_110;
  DynamicRectMatrix<double> *local_108;
  DynamicVector<double,_std::allocator<double>_> *local_100;
  ulong local_f8;
  ulong local_e0;
  ulong local_d8;
  DynamicRectMatrix<double> local_c0;
  ulong local_b0;
  pointer local_a8;
  vector<double,_std::allocator<double>_> local_90;
  ulong local_78;
  ulong local_68;
  DynamicRectMatrix<double> local_50;
  DynamicRectMatrix<double> local_40;
  
  local_108 = &this->V;
  (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->V).data_ = (double **)0x0;
  (this->V).nrow_ = 0;
  (this->V).ncol_ = 0;
  (this->U).data_ = (double **)0x0;
  (this->U).nrow_ = 0;
  (this->U).ncol_ = 0;
  (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = Arg->nrow_;
  this->m = uVar8;
  uVar9 = Arg->ncol_;
  this->n = uVar9;
  local_128 = uVar8;
  if ((int)uVar9 < (int)uVar8) {
    local_128 = uVar9;
  }
  uVar13 = uVar8 + 1;
  if ((int)uVar9 < (int)(uVar8 + 1)) {
    uVar13 = uVar9;
  }
  local_100 = &this->s;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_140,(long)(int)uVar13,(allocator_type *)&local_90);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&(this->s).data_,&local_140);
  if ((double **)
      local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double **)0x0) {
    operator_delete(local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
            ((DynamicRectMatrix<double> *)&local_140,this->m,local_128,0.0);
  pDVar22 = local_100;
  OpenMD::DynamicRectMatrix<double>::operator=(&local_40,&this->U);
  OpenMD::DynamicRectMatrix<double>::deallocate(&local_40);
  OpenMD::DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&local_140);
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
            ((DynamicRectMatrix<double> *)&local_140,this->n,this->n);
  OpenMD::DynamicRectMatrix<double>::operator=(&local_50,local_108);
  OpenMD::DynamicRectMatrix<double>::deallocate(&local_50);
  OpenMD::DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&local_140);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_140,(long)this->n,(allocator_type *)&local_90);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_90,(long)this->m,(allocator_type *)&local_c0);
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix(&local_c0,Arg);
  uVar8 = this->m;
  uVar9 = this->n;
  uVar13 = uVar8 - 1;
  if ((int)uVar9 < (int)(uVar8 - 1)) {
    uVar13 = uVar9;
  }
  uVar23 = (ulong)uVar13;
  uVar10 = uVar9 - 2;
  if ((int)uVar8 < (int)(uVar9 - 2)) {
    uVar10 = uVar8;
  }
  uVar8 = 0;
  if (0 < (int)uVar10) {
    uVar8 = uVar10;
  }
  local_78 = (ulong)uVar8;
  uVar19 = local_78;
  if ((int)uVar8 < (int)uVar13) {
    uVar19 = uVar23;
  }
  local_b0 = (ulong)(int)uVar10;
  local_a8 = (pointer)(long)(int)uVar13;
  if ((int)uVar19 != 0) {
    local_f8 = 1;
    uVar15 = 0;
    local_e0 = uVar23;
    local_68 = uVar19;
    do {
      pdVar6 = local_a8;
      if ((long)uVar15 < (long)local_a8) {
        (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar15] = 0.0;
        uVar8 = this->m;
        uVar23 = uVar15;
        if ((long)uVar15 < (long)(int)uVar8) {
          do {
            dVar25 = hypot((this->s).data_.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar15],
                           local_c0.data_[uVar23][uVar15]);
            (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15] = dVar25;
            uVar23 = uVar23 + 1;
            uVar8 = this->m;
          } while ((int)uVar23 < (int)uVar8);
        }
        pdVar2 = (pDVar22->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar25 = pdVar2[uVar15];
        if ((dVar25 != 0.0) || (NAN(dVar25))) {
          pdVar26 = local_c0.data_[uVar15];
          if (pdVar26[uVar15] <= 0.0 && pdVar26[uVar15] != 0.0) {
            pdVar2[uVar15] = -dVar25;
          }
          if ((long)uVar15 < (long)(int)uVar8) {
            uVar23 = uVar15;
            do {
              local_c0.data_[uVar23][uVar15] = local_c0.data_[uVar23][uVar15] / pdVar2[uVar15];
              uVar23 = uVar23 + 1;
            } while (uVar8 != uVar23);
          }
          pdVar26[uVar15] = pdVar26[uVar15] + 1.0;
        }
        pdVar2[uVar15] = -pdVar2[uVar15];
      }
      local_110 = (double **)(uVar15 + 1);
      uVar8 = this->n;
      if ((long)local_110 < (long)(int)uVar8) {
        pdVar2 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = this->m;
        pdVar26 = local_c0.data_[uVar15];
        uVar23 = local_f8;
        do {
          if (((long)uVar15 < (long)pdVar6) &&
             ((dVar25 = pdVar2[uVar15], dVar25 != 0.0 || (NAN(dVar25))))) {
            dVar25 = 0.0;
            uVar19 = uVar15;
            if ((long)uVar15 < (long)(int)uVar9) {
              do {
                dVar25 = dVar25 + local_c0.data_[uVar19][uVar15] * local_c0.data_[uVar19][uVar23];
                uVar19 = uVar19 + 1;
              } while (uVar9 != uVar19);
            }
            if ((long)uVar15 < (long)(int)uVar9) {
              dVar1 = local_c0.data_[uVar15][uVar15];
              uVar19 = uVar15;
              do {
                pdVar27 = local_c0.data_[uVar19];
                pdVar27[uVar23] = pdVar27[uVar15] * (-dVar25 / dVar1) + pdVar27[uVar23];
                uVar19 = uVar19 + 1;
              } while (uVar9 != uVar19);
            }
          }
          local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar23] = (double)pdVar26[uVar23];
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar8);
      }
      if (((long)uVar15 < (long)pdVar6) && (uVar8 = this->m, (long)uVar15 < (long)(int)uVar8)) {
        ppdVar17 = (this->U).data_;
        uVar23 = uVar15;
        do {
          ppdVar17[uVar23][uVar15] = local_c0.data_[uVar23][uVar15];
          uVar23 = uVar23 + 1;
        } while (uVar8 != uVar23);
      }
      if ((long)uVar15 < (long)local_b0) {
        local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar15] = 0.0;
        uVar8 = this->n;
        uVar23 = local_f8;
        if ((long)local_110 < (long)(int)uVar8) {
          do {
            pdVar26 = (double *)
                      hypot((double)local_140.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar15],
                            (double)local_140.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar23]);
            local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15] = (double)pdVar26;
            uVar23 = uVar23 + 1;
            uVar8 = this->n;
          } while ((int)uVar23 < (int)uVar8);
        }
        pdVar6 = local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar26 = (double *)
                  local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar15];
        local_d8 = (ulong)(int)uVar8;
        if (((double)pdVar26 != 0.0) || (NAN((double)pdVar26))) {
          if ((double)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)local_110] <= 0.0 &&
              (double)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)local_110] != 0.0) {
            local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15] = (double)((ulong)pdVar26 ^ 0x8000000000000000)
            ;
          }
          if ((long)local_110 < (long)local_d8) {
            uVar23 = local_f8;
            do {
              local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar23] =
                   (double)((double)local_140.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar23] /
                           (double)local_140.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar15]);
              uVar23 = uVar23 + 1;
            } while (uVar8 != uVar23);
          }
          local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[(long)local_110] =
               (double)((double)local_140.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[(long)local_110] + 1.0);
        }
        pdVar26 = (double *)
                  local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar15];
        pdVar27 = (double *)-(double)pdVar26;
        local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar15] = (double)pdVar27;
        uVar9 = this->m;
        if ((double)pdVar27 != (double)pdVar26 && (long)local_110 < (long)(int)uVar9) {
          memset(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar15 + 1,0,
                 (ulong)((uVar9 - (int)uVar15) - 2) * 8 + 8);
          if ((long)local_110 < (long)local_d8) {
            uVar23 = local_f8;
            uVar19 = local_f8;
            do {
              do {
                local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar23] =
                     (double)pdVar6[uVar19] * local_c0.data_[uVar23][uVar19] +
                     local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar23];
                uVar23 = uVar23 + 1;
              } while (uVar9 != uVar23);
              uVar19 = uVar19 + 1;
              uVar23 = local_f8;
            } while (uVar19 != uVar8);
          }
          if ((long)local_110 < (long)local_d8) {
            uVar23 = local_f8;
            do {
              if ((long)local_110 < (long)(int)uVar9) {
                pdVar26 = (double *)pdVar6[uVar23];
                pdVar27 = (double *)pdVar6[(long)local_110];
                uVar19 = local_f8;
                do {
                  local_c0.data_[uVar19][uVar23] =
                       local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar19] *
                       (-(double)pdVar26 / (double)pdVar27) + local_c0.data_[uVar19][uVar23];
                  uVar19 = uVar19 + 1;
                } while (uVar9 != uVar19);
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != uVar8);
          }
        }
        pDVar22 = local_100;
        if ((long)local_110 < (long)local_d8) {
          ppdVar17 = local_108->data_;
          uVar23 = local_f8;
          do {
            ppdVar17[uVar23][uVar15] = (double)pdVar6[uVar23];
            uVar23 = uVar23 + 1;
          } while (uVar8 != uVar23);
        }
      }
      local_f8 = local_f8 + 1;
      uVar23 = local_e0;
      uVar15 = (ulong)local_110;
    } while (local_110 != (double **)local_68);
  }
  uVar8 = this->m;
  lVar14 = (long)(int)uVar8;
  uVar9 = this->n;
  uVar19 = (ulong)uVar9;
  uVar13 = uVar8 + 1;
  if ((int)uVar9 <= (int)(uVar8 + 1)) {
    uVar13 = uVar9;
  }
  uVar21 = (ulong)uVar13;
  iVar11 = (int)uVar23;
  uVar15 = uVar23 & 0xffffffff;
  if (iVar11 < (int)uVar9) {
    (pDVar22->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[(long)local_a8] = local_c0.data_[uVar15][uVar15];
  }
  if ((int)uVar8 < (int)uVar9) {
    (pDVar22->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[(long)(int)uVar13 + -1] = 0.0;
  }
  if ((int)local_78 + 1 < (int)uVar13) {
    local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[local_78 & 0xffffffff] = (double)local_c0.data_[local_78 & 0xffffffff][uVar13 - 1];
  }
  local_110 = (double **)
              local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[(long)(int)uVar13 + -1] = 0.0;
  if (iVar11 < (int)local_128) {
    ppdVar17 = (this->U).data_;
    uVar23 = uVar23 & 0xffffffff;
    do {
      if (0 < (int)uVar8) {
        uVar18 = 0;
        do {
          ppdVar17[uVar18][uVar23] = 0.0;
          uVar18 = uVar18 + 1;
        } while (uVar8 != uVar18);
      }
      ppdVar17[uVar23][uVar23] = 1.0;
      uVar10 = (int)uVar23 + 1;
      uVar23 = (ulong)uVar10;
    } while (uVar10 != local_128);
  }
  local_f8 = (ulong)(int)local_128;
  if (0 < iVar11) {
    ppdVar3 = (this->U).data_;
    local_a8 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    uVar23 = (ulong)(iVar11 - 1);
    uVar10 = iVar11 - 2;
    lVar24 = uVar23 * 8;
    ppdVar17 = ppdVar3 + uVar23;
    do {
      uVar18 = (ulong)uVar10;
      uVar16 = uVar15 - 1;
      if ((local_a8[uVar15 - 1] != 0.0) || (NAN(local_a8[uVar15 - 1]))) {
        iVar11 = (int)uVar23;
        if ((long)uVar15 < (long)local_f8) {
          pdVar26 = ppdVar3[uVar16];
          ppdVar4 = (this->U).data_;
          uVar12 = uVar15;
          do {
            dVar25 = 0.0;
            if ((long)uVar15 <= lVar14) {
              lVar20 = 0;
              do {
                lVar5 = *(long *)((long)ppdVar4 + lVar20 * 8 + lVar24);
                dVar25 = dVar25 + *(double *)(lVar5 + uVar16 * 8) * *(double *)(lVar5 + uVar12 * 8);
                lVar20 = lVar20 + 1;
              } while ((int)lVar20 + iVar11 < (int)uVar8);
            }
            if ((long)uVar15 <= lVar14) {
              dVar1 = pdVar26[uVar16];
              lVar20 = 0;
              do {
                pdVar27 = ppdVar17[lVar20];
                pdVar27[uVar12] = pdVar27[uVar16] * (-dVar25 / dVar1) + pdVar27[uVar12];
                lVar20 = lVar20 + 1;
              } while ((int)lVar20 + iVar11 < (int)uVar8);
            }
            uVar12 = uVar12 + 1;
          } while ((int)uVar12 < (int)local_128);
        }
        if ((long)uVar15 <= lVar14) {
          lVar20 = 0;
          do {
            ppdVar17[lVar20][uVar16] = -ppdVar17[lVar20][uVar16];
            lVar20 = lVar20 + 1;
          } while ((int)lVar20 + iVar11 < (int)uVar8);
        }
        ppdVar3[uVar16][uVar16] = ppdVar3[uVar16][uVar16] + 1.0;
        local_e0 = uVar18;
        if (2 < (long)uVar15) {
          uVar12 = 0;
          do {
            ppdVar3[uVar12][uVar16] = 0.0;
            uVar12 = uVar12 + 1;
          } while (uVar18 != uVar12);
        }
      }
      else {
        if (0 < (int)uVar8) {
          uVar18 = 0;
          do {
            ppdVar3[uVar18][uVar16] = 0.0;
            uVar18 = uVar18 + 1;
          } while (uVar8 != uVar18);
        }
        ppdVar3[uVar16][uVar16] = 1.0;
      }
      uVar23 = uVar23 - 1;
      uVar10 = uVar10 - 1;
      lVar24 = lVar24 + -8;
      ppdVar17 = ppdVar17 + -1;
      bVar7 = 1 < (long)uVar15;
      uVar15 = uVar16;
      local_d8 = uVar21;
    } while (bVar7);
  }
  if (0 < (int)uVar9) {
    ppdVar3 = local_108->data_;
    lVar14 = uVar19 * 8;
    ppdVar17 = ppdVar3 + uVar19;
    uVar23 = uVar19;
    do {
      uVar15 = uVar23 - 1;
      if (((long)uVar23 < (long)local_f8 && (long)uVar23 <= (long)local_b0) &&
          (double)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar23 - 1] != 0.0) {
        pdVar26 = ppdVar3[uVar23];
        ppdVar4 = local_108->data_;
        uVar18 = uVar23;
        do {
          dVar25 = 0.0;
          if ((long)uVar23 < (long)uVar19) {
            lVar24 = 0;
            do {
              lVar20 = *(long *)((long)ppdVar4 + lVar24 * 8 + lVar14);
              dVar25 = dVar25 + *(double *)(lVar20 + uVar15 * 8) * *(double *)(lVar20 + uVar18 * 8);
              lVar24 = lVar24 + 1;
            } while ((int)lVar24 + (int)uVar23 < (int)uVar9);
          }
          if ((long)uVar23 < (long)uVar19) {
            dVar1 = pdVar26[uVar15];
            lVar24 = 0;
            do {
              pdVar27 = ppdVar17[lVar24];
              pdVar27[uVar18] = pdVar27[uVar15] * (-dVar25 / dVar1) + pdVar27[uVar18];
              lVar24 = lVar24 + 1;
            } while ((int)lVar24 + (int)uVar23 < (int)uVar9);
          }
          uVar18 = uVar18 + 1;
        } while ((int)uVar18 < (int)local_128);
      }
      uVar18 = 0;
      do {
        ppdVar3[uVar18][uVar15] = 0.0;
        uVar18 = uVar18 + 1;
      } while (uVar19 != uVar18);
      ppdVar3[uVar15][uVar15] = 1.0;
      lVar14 = lVar14 + -8;
      ppdVar17 = ppdVar17 + -1;
      bVar7 = 1 < (long)uVar23;
      uVar23 = uVar15;
    } while (bVar7);
  }
  if ((int)uVar13 < 1) {
    OpenMD::DynamicRectMatrix<double>::deallocate(&local_c0);
    if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((double **)
        local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double **)0x0) {
      operator_delete(local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  local_110 = (double **)
              CONCAT44((int)((ulong)local_140.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 0x20),uVar13 - 1);
  uVar8 = uVar13 - 2;
  uVar23 = (ulong)uVar8;
  if (uVar8 != 0xffffffff) {
    uVar19 = uVar21;
    do {
      pdVar26 = (local_100->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + (uVar19 - 2);
      if (ABS((double)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar19 - 2]) <=
          (ABS(pdVar26[1]) + ABS(*pdVar26)) * 2.220446049250313e-16) {
        uVar23 = (ulong)((int)uVar19 - 2);
        local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar19 - 2] = 0.0;
        goto LAB_00261d69;
      }
      uVar19 = uVar19 - 1;
    } while (uVar19 != 1);
    uVar23 = 0xffffffff;
  }
LAB_00261d69:
  uVar9 = (uint)uVar23;
  iVar11 = 4;
  if (uVar9 != uVar8) {
    uVar13 = uVar13 - 1;
    uVar19 = (ulong)uVar13;
    if ((int)uVar9 < (int)uVar13) {
      pdVar6 = (local_100->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar19 = uVar21 - 1;
      do {
        dVar25 = 0.0;
        if ((long)(int)(uVar9 + 1) != uVar19) {
          dVar25 = ABS((double)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[uVar19 - 1]);
        }
        if (ABS(pdVar6[uVar19]) <=
            (ABS((double)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar19]) + dVar25) * 2.220446049250313e-16
           ) {
          pdVar6[uVar19] = 0.0;
          break;
        }
        uVar19 = uVar19 - 1;
      } while ((long)(int)uVar9 < (long)uVar19);
    }
    uVar8 = (uint)uVar19;
    uVar19 = uVar19 & 0xffffffff;
    if (uVar8 == uVar13) {
      uVar19 = uVar23;
    }
    uVar23 = uVar19;
    iVar11 = (uVar8 != uVar13) + 1;
    if (uVar8 == uVar9) {
      iVar11 = 3;
    }
  }
  local_b0 = uVar21;
  (*(code *)(&DAT_002a6d34 + *(int *)(&DAT_002a6d34 + (ulong)(iVar11 - 1) * 4)))
            ((ulong)(iVar11 - 1),&DAT_002a6d34,
             &DAT_002a6d34 + *(int *)(&DAT_002a6d34 + (ulong)(iVar11 - 1) * 4),uVar23);
  return;
}

Assistant:

SVD(const DynamicRectMatrix<Real>& Arg) {
      m      = Arg.getNRow();
      n      = Arg.getNCol();
      int nu = min(m, n);
      s      = DynamicVector<Real>(min(m + 1, n));
      U      = DynamicRectMatrix<Real>(m, nu, Real(0));
      V      = DynamicRectMatrix<Real>(n, n);
      DynamicVector<Real> e(n);
      DynamicVector<Real> work(m);
      DynamicRectMatrix<Real> A(Arg);

      int wantu = 1; /* boolean */
      int wantv = 1; /* boolean */
      int i = 0, j = 0, k = 0;

      // Reduce A to bidiagonal form, storing the diagonal elements
      // in s and the super-diagonal elements in e.

      int nct = min(m - 1, n);
      int nrt = max(0, min(n - 2, m));

      for (k = 0; k < max(nct, nrt); k++) {
        if (k < nct) {
          // Compute the transformation for the k-th column and
          // place the k-th diagonal in s(k).
          // Compute 2-norm of k-th column without under/overflow.
          s(k) = 0;
          for (i = k; i < m; i++) {
            s(k) = hypot(s(k), A(i, k));
          }
          if (s(k) != 0.0) {
            if (A(k, k) < 0.0) { s(k) = -s(k); }
            for (i = k; i < m; i++) {
              A(i, k) /= s(k);
            }
            A(k, k) += 1.0;
          }
          s(k) = -s(k);
        }
        for (j = k + 1; j < n; j++) {
          if ((k < nct) && (s(k) != 0.0)) {
            // Apply the transformation.

            Real t(0.0);
            for (i = k; i < m; i++) {
              t += A(i, k) * A(i, j);
            }
            t = -t / A(k, k);
            for (i = k; i < m; i++) {
              A(i, j) += t * A(i, k);
            }
          }

          // Place the k-th row of A into e for the
          // subsequent calculation of the row transformation.

          e(j) = A(k, j);
        }
        if (wantu & (k < nct)) {
          // Place the transformation in U for subsequent back
          // multiplication.

          for (i = k; i < m; i++) {
            U(i, k) = A(i, k);
          }
        }
        if (k < nrt) {
          // Compute the k-th row transformation and place the
          // k-th super-diagonal in e(k).
          // Compute 2-norm without under/overflow.
          e(k) = 0;
          for (i = k + 1; i < n; i++) {
            e(k) = hypot(e(k), e(i));
          }
          if (e(k) != 0.0) {
            if (e(k + 1) < 0.0) { e(k) = -e(k); }
            for (i = k + 1; i < n; i++) {
              e(i) /= e(k);
            }
            e(k + 1) += 1.0;
          }
          e(k) = -e(k);
          if ((k + 1 < m) & (e(k) != 0.0)) {
            // Apply the transformation.

            for (i = k + 1; i < m; i++) {
              work(i) = 0.0;
            }
            for (j = k + 1; j < n; j++) {
              for (i = k + 1; i < m; i++) {
                work(i) += e(j) * A(i, j);
              }
            }
            for (j = k + 1; j < n; j++) {
              Real t(-e(j) / e(k + 1));
              for (i = k + 1; i < m; i++) {
                A(i, j) += t * work(i);
              }
            }
          }
          if (wantv) {
            // Place the transformation in V for subsequent
            // back multiplication.

            for (i = k + 1; i < n; i++) {
              V(i, k) = e(i);
            }
          }
        }
      }

      // Set up the final bidiagonal matrix or order p.

      int p = min(n, m + 1);
      if (nct < n) { s(nct) = A(nct, nct); }
      if (m < p) { s(p - 1) = 0.0; }
      if (nrt + 1 < p) { e(nrt) = A(nrt, p - 1); }
      e(p - 1) = 0.0;

      // If required, generate U.

      if (wantu) {
        for (j = nct; j < nu; j++) {
          for (i = 0; i < m; i++) {
            U(i, j) = 0.0;
          }
          U(j, j) = 1.0;
        }
        for (k = nct - 1; k >= 0; k--) {
          if (s(k) != 0.0) {
            for (j = k + 1; j < nu; j++) {
              Real t(0.0);
              for (i = k; i < m; i++) {
                t += U(i, k) * U(i, j);
              }
              t = -t / U(k, k);
              for (i = k; i < m; i++) {
                U(i, j) += t * U(i, k);
              }
            }
            for (i = k; i < m; i++) {
              U(i, k) = -U(i, k);
            }
            U(k, k) = 1.0 + U(k, k);
            for (i = 0; i < k - 1; i++) {
              U(i, k) = 0.0;
            }
          } else {
            for (i = 0; i < m; i++) {
              U(i, k) = 0.0;
            }
            U(k, k) = 1.0;
          }
        }
      }

      // If required, generate V.

      if (wantv) {
        for (k = n - 1; k >= 0; k--) {
          if ((k < nrt) & (e(k) != 0.0)) {
            for (j = k + 1; j < nu; j++) {
              Real t(0.0);
              for (i = k + 1; i < n; i++) {
                t += V(i, k) * V(i, j);
              }
              t = -t / V(k + 1, k);
              for (i = k + 1; i < n; i++) {
                V(i, j) += t * V(i, k);
              }
            }
          }
          for (i = 0; i < n; i++) {
            V(i, k) = 0.0;
          }
          V(k, k) = 1.0;
        }
      }

      // Main iteration loop for the singular values.

      int pp   = p - 1;
      int iter = 0;
      Real eps(pow(2.0, -52.0));
      while (p > 0) {
        int k    = 0;
        int kase = 0;

        // Here is where a test for too many iterations would go.

        // This section of the program inspects for
        // negligible elements in the s and e arrays.  On
        // completion the variables kase and k are set as follows.

        // kase = 1     if s(p) and e(k-1) are negligible and k<p
        // kase = 2     if s(k) is negligible and k<p
        // kase = 3     if e(k-1) is negligible, k<p, and
        //              s(k), ..., s(p) are not negligible (qr step).
        // kase = 4     if e(p-1) is negligible (convergence).

        for (k = p - 2; k >= -1; k--) {
          if (k == -1) { break; }
          if (abs(e(k)) <= eps * (abs(s(k)) + abs(s(k + 1)))) {
            e(k) = 0.0;
            break;
          }
        }
        if (k == p - 2) {
          kase = 4;
        } else {
          int ks;
          for (ks = p - 1; ks >= k; ks--) {
            if (ks == k) { break; }
            Real t((ks != p ? abs(e(ks)) : 0.) +
                   (ks != k + 1 ? abs(e(ks - 1)) : 0.));
            if (abs(s(ks)) <= eps * t) {
              s(ks) = 0.0;
              break;
            }
          }
          if (ks == k) {
            kase = 3;
          } else if (ks == p - 1) {
            kase = 1;
          } else {
            kase = 2;
            k    = ks;
          }
        }
        k++;

        // Perform the task indicated by kase.

        switch (kase) {
          // Deflate negligible s(p).

        case 1: {
          Real f(e(p - 2));
          e(p - 2) = 0.0;
          for (j = p - 2; j >= k; j--) {
            Real t(hypot(s(j), f));
            Real cs(s(j) / t);
            Real sn(f / t);
            s(j) = t;
            if (j != k) {
              f        = -sn * e(j - 1);
              e(j - 1) = cs * e(j - 1);
            }
            if (wantv) {
              for (i = 0; i < n; i++) {
                t           = cs * V(i, j) + sn * V(i, p - 1);
                V(i, p - 1) = -sn * V(i, j) + cs * V(i, p - 1);
                V(i, j)     = t;
              }
            }
          }
        } break;

          // Split at negligible s(k).

        case 2: {
          Real f(e(k - 1));
          e(k - 1) = 0.0;
          for (j = k; j < p; j++) {
            Real t(hypot(s(j), f));
            Real cs(s(j) / t);
            Real sn(f / t);
            s(j) = t;
            f    = -sn * e(j);
            e(j) = cs * e(j);
            if (wantu) {
              for (i = 0; i < m; i++) {
                t           = cs * U(i, j) + sn * U(i, k - 1);
                U(i, k - 1) = -sn * U(i, j) + cs * U(i, k - 1);
                U(i, j)     = t;
              }
            }
          }
        } break;

          // Perform one qr step.

        case 3: {
          // Calculate the shift.

          Real scale =
              max(max(max(max(abs(s(p - 1)), abs(s(p - 2))), abs(e(p - 2))),
                      abs(s(k))),
                  abs(e(k)));
          Real sp    = s(p - 1) / scale;
          Real spm1  = s(p - 2) / scale;
          Real epm1  = e(p - 2) / scale;
          Real sk    = s(k) / scale;
          Real ek    = e(k) / scale;
          Real b     = ((spm1 + sp) * (spm1 - sp) + epm1 * epm1) / 2.0;
          Real c     = (sp * epm1) * (sp * epm1);
          Real shift = 0.0;
          if ((b != 0.0) || (c != 0.0)) {
            shift = sqrt(b * b + c);
            if (b < 0.0) { shift = -shift; }
            shift = c / (b + shift);
          }
          Real f = (sk + sp) * (sk - sp) + shift;
          Real g = sk * ek;

          // Chase zeros.

          for (j = k; j < p - 1; j++) {
            Real t  = hypot(f, g);
            Real cs = f / t;
            Real sn = g / t;
            if (j != k) { e(j - 1) = t; }
            f        = cs * s(j) + sn * e(j);
            e(j)     = cs * e(j) - sn * s(j);
            g        = sn * s(j + 1);
            s(j + 1) = cs * s(j + 1);
            if (wantv) {
              for (i = 0; i < n; i++) {
                t           = cs * V(i, j) + sn * V(i, j + 1);
                V(i, j + 1) = -sn * V(i, j) + cs * V(i, j + 1);
                V(i, j)     = t;
              }
            }
            t        = hypot(f, g);
            cs       = f / t;
            sn       = g / t;
            s(j)     = t;
            f        = cs * e(j) + sn * s(j + 1);
            s(j + 1) = -sn * e(j) + cs * s(j + 1);
            g        = sn * e(j + 1);
            e(j + 1) = cs * e(j + 1);
            if (wantu && (j < m - 1)) {
              for (i = 0; i < m; i++) {
                t           = cs * U(i, j) + sn * U(i, j + 1);
                U(i, j + 1) = -sn * U(i, j) + cs * U(i, j + 1);
                U(i, j)     = t;
              }
            }
          }
          e(p - 2) = f;
          iter     = iter + 1;
        } break;

          // Convergence.

        case 4: {
          // Make the singular values positive.

          if (s(k) <= 0.0) {
            s(k) = (s(k) < 0.0 ? -s(k) : 0.0);
            if (wantv) {
              for (i = 0; i <= pp; i++) {
                V(i, k) = -V(i, k);
              }
            }
          }

          // Order the singular values.

          while (k < pp) {
            if (s(k) >= s(k + 1)) { break; }
            Real t   = s(k);
            s(k)     = s(k + 1);
            s(k + 1) = t;
            if (wantv && (k < n - 1)) {
              for (i = 0; i < n; i++) {
                t           = V(i, k + 1);
                V(i, k + 1) = V(i, k);
                V(i, k)     = t;
              }
            }
            if (wantu && (k < m - 1)) {
              for (i = 0; i < m; i++) {
                t           = U(i, k + 1);
                U(i, k + 1) = U(i, k);
                U(i, k)     = t;
              }
            }
            k++;
          }
          iter = 0;
          p--;
        } break;
        }
      }
    }